

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mssbcbs.c
# Opt level: O0

char * saslmssbcbs_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)

{
  char *local_18;
  char *result;
  CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_local;
  
  if (sasl_mechanism == (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = "MSSBCBS";
  }
  return local_18;
}

Assistant:

const char* saslmssbcbs_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)
{
    const char* result;

    if (sasl_mechanism == NULL)
    {
        result = NULL;
    }
    else
    {
        result = "MSSBCBS";
    }

    return result;
}